

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

IColourImpl * Catch::anon_unknown_24::platformColourInstance(void)

{
  bool bVar1;
  int iVar2;
  IContext *pIVar3;
  type tVar4;
  IConfig *pIVar5;
  bool bVar6;
  IColourImpl *local_60;
  int local_48;
  int local_28;
  YesOrNo colourMode;
  Ptr<const_Catch::IConfig> local_18;
  Ptr<const_Catch::IConfig> config;
  ErrnoGuard guard;
  
  ErrnoGuard::ErrnoGuard((ErrnoGuard *)((long)&config.m_p + 4));
  pIVar3 = getCurrentContext();
  (*pIVar3->_vptr_IContext[6])(&local_18);
  tVar4 = Catch::Ptr::operator_cast_to_function_pointer((Ptr *)&local_18);
  if (tVar4 == 0) {
    local_48 = 0;
  }
  else {
    pIVar5 = Ptr<const_Catch::IConfig>::operator->(&local_18);
    local_48 = (*(pIVar5->super_IShared).super_NonCopyable._vptr_NonCopyable[0x10])();
  }
  local_28 = local_48;
  if (local_48 == 0) {
    bVar1 = isDebuggerActive();
    bVar6 = false;
    if (!bVar1) {
      iVar2 = isatty(1);
      bVar6 = iVar2 != 0;
    }
    local_28 = 2;
    if (bVar6) {
      local_28 = 1;
    }
  }
  if (local_28 == 1) {
    local_60 = PosixColourImpl::instance();
  }
  else {
    local_60 = NoColourImpl::instance();
  }
  Ptr<const_Catch::IConfig>::~Ptr(&local_18);
  ErrnoGuard::~ErrnoGuard((ErrnoGuard *)((long)&config.m_p + 4));
  return local_60;
}

Assistant:

IColourImpl* platformColourInstance() {
        ErrnoGuard guard;
        Ptr<IConfig const> config = getCurrentContext().getConfig();
        UseColour::YesOrNo colourMode = config
            ? config->useColour()
            : UseColour::Auto;
        if( colourMode == UseColour::Auto )
            colourMode = (!isDebuggerActive() && isatty(STDOUT_FILENO) )
                ? UseColour::Yes
                : UseColour::No;
        return colourMode == UseColour::Yes
            ? PosixColourImpl::instance()
            : NoColourImpl::instance();
    }